

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O2

int IDASetMaxNonlinIters(void *ida_mem,int maxcor)

{
  int iVar1;
  int error_code;
  undefined4 in_register_00000034;
  long lVar2;
  char *msgfmt;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    error_code = -0x14;
    iVar1 = 0x1e1;
  }
  else if ((*(int *)((long)ida_mem + 0x9c) == 0) || (*(int *)((long)ida_mem + 0xa4) != 1)) {
    lVar2 = *(long *)((long)ida_mem + 0x6c8);
    if (lVar2 != 0) goto LAB_0011b851;
    msgfmt = "A memory request failed.";
    error_code = -0x15;
    iVar1 = 0x1fb;
  }
  else {
    lVar2 = *(long *)((long)ida_mem + 0x6d8);
    if (lVar2 != 0) {
LAB_0011b851:
      iVar1 = SUNNonlinSolSetMaxIters(lVar2,CONCAT44(in_register_00000034,maxcor));
      return iVar1;
    }
    msgfmt = "A memory request failed.";
    error_code = -0x15;
    iVar1 = 0x1ef;
  }
  IDAProcessError((IDAMem)0x0,error_code,iVar1,"IDASetMaxNonlinIters",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int IDASetMaxNonlinIters(void* ida_mem, int maxcor)
{
  IDAMem IDA_mem;
  sunbooleantype sensi_sim;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  /* Are we computing sensitivities with the simultaneous approach? */
  sensi_sim = (IDA_mem->ida_sensi && (IDA_mem->ida_ism == IDA_SIMULTANEOUS));

  if (sensi_sim)
  {
    /* check that the NLS is non-NULL */
    if (IDA_mem->NLSsim == NULL)
    {
      IDAProcessError(NULL, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_MEM_FAIL);
      return (IDA_MEM_FAIL);
    }

    return (SUNNonlinSolSetMaxIters(IDA_mem->NLSsim, maxcor));
  }
  else
  {
    /* check that the NLS is non-NULL */
    if (IDA_mem->NLS == NULL)
    {
      IDAProcessError(NULL, IDA_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_MEM_FAIL);
      return (IDA_MEM_FAIL);
    }

    return (SUNNonlinSolSetMaxIters(IDA_mem->NLS, maxcor));
  }
}